

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O0

string * __thiscall
google::protobuf::TextFormat::FieldValuePrinter::PrintBool_abi_cxx11_
          (FieldValuePrinter *this,bool val)

{
  string *psVar1;
  byte in_DL;
  StringBaseTextGenerator *in_RDI;
  StringBaseTextGenerator generator;
  undefined8 in_stack_ffffffffffffff88;
  undefined1 val_00;
  StringBaseTextGenerator *this_00;
  StringBaseTextGenerator local_40 [47];
  byte local_11;
  
  val_00 = (undefined1)((ulong)in_stack_ffffffffffffff88 >> 0x38);
  local_11 = in_DL & 1;
  this_00 = in_RDI;
  anon_unknown_19::StringBaseTextGenerator::StringBaseTextGenerator(in_RDI);
  FastFieldValuePrinter::PrintBool
            ((FastFieldValuePrinter *)this_00,(bool)val_00,(BaseTextGenerator *)0x445a87);
  psVar1 = (anonymous_namespace)::StringBaseTextGenerator::Get_abi_cxx11_(local_40);
  std::__cxx11::string::string((string *)this_00,(string *)psVar1);
  anon_unknown_19::StringBaseTextGenerator::~StringBaseTextGenerator(this_00);
  return (string *)in_RDI;
}

Assistant:

std::string TextFormat::FieldValuePrinter::PrintBool(bool val) const {
  FORWARD_IMPL(PrintBool, val);
}